

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int walIndexAppend(Wal *pWal,u32 iFrame,u32 iPage)

{
  int iVar1;
  ulong uVar2;
  u32 *puVar3;
  undefined4 in_register_00000034;
  u32 *puVar4;
  int iVar5;
  int iVar6;
  bool bVar7;
  u32 *aPgno;
  u32 *local_40;
  undefined8 local_38;
  
  local_38 = CONCAT44(in_register_00000034,iFrame);
  iVar5 = (int)((ulong)(iFrame + 0x1000) + 0xffffffff021 >> 0xc);
  iVar1 = walIndexPage(pWal,iVar5,&local_40);
  puVar4 = local_40;
  if (iVar1 == 0) {
    if (iVar5 == 0) {
      local_40 = local_40 + 0x22;
      iVar5 = 0;
    }
    else {
      iVar5 = iVar5 * 0x1000 + -0x22;
    }
    puVar4 = puVar4 + 0x1000;
    puVar3 = local_40 + -1;
  }
  else {
    iVar5 = 0;
    puVar3 = (u32 *)0x0;
    puVar4 = (u32 *)0x0;
  }
  if (iVar1 == 0) {
    iVar6 = (int)local_38 - iVar5;
    if (iVar6 == 1) {
      memset(puVar3 + 1,0,(long)(((int)puVar4 - (int)(puVar3 + 1)) + 0x4000));
    }
    if (puVar3[iVar6] != 0) {
      walCleanupHash(pWal);
    }
    uVar2 = (ulong)(iPage * 0x17f & 0x1fff);
    bVar7 = *(short *)((long)puVar4 + uVar2 * 2) == 0;
    if (bVar7) {
LAB_00122b0f:
      puVar3[iVar6] = iPage;
      *(short *)((long)puVar4 + uVar2 * 2) = (short)iVar6;
    }
    else {
      if (iVar6 != 0) {
        iVar5 = iVar5 - (int)local_38;
        do {
          uVar2 = (ulong)((int)uVar2 + 1U & 0x1fff);
          bVar7 = *(short *)((long)puVar4 + uVar2 * 2) == 0;
          if (bVar7) goto LAB_00122b0f;
          iVar5 = iVar5 + 1;
        } while (iVar5 != 0);
      }
      sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0xd82c,
                  "ada05cfa86ad7f5645450ac7a2a21c9aa6e57d2c");
    }
    if (!bVar7) {
      return 0xb;
    }
  }
  return iVar1;
}

Assistant:

static int walIndexAppend(Wal *pWal, u32 iFrame, u32 iPage){
  int rc;                         /* Return code */
  u32 iZero = 0;                  /* One less than frame number of aPgno[1] */
  volatile u32 *aPgno = 0;        /* Page number array */
  volatile ht_slot *aHash = 0;    /* Hash table */

  rc = walHashGet(pWal, walFramePage(iFrame), &aHash, &aPgno, &iZero);

  /* Assuming the wal-index file was successfully mapped, populate the
  ** page number array and hash table entry.
  */
  if( rc==SQLITE_OK ){
    int iKey;                     /* Hash table key */
    int idx;                      /* Value to write to hash-table slot */
    int nCollide;                 /* Number of hash collisions */

    idx = iFrame - iZero;
    assert( idx <= HASHTABLE_NSLOT/2 + 1 );
    
    /* If this is the first entry to be added to this hash-table, zero the
    ** entire hash table and aPgno[] array before proceeding. 
    */
    if( idx==1 ){
      int nByte = (int)((u8 *)&aHash[HASHTABLE_NSLOT] - (u8 *)&aPgno[1]);
      memset((void*)&aPgno[1], 0, nByte);
    }

    /* If the entry in aPgno[] is already set, then the previous writer
    ** must have exited unexpectedly in the middle of a transaction (after
    ** writing one or more dirty pages to the WAL to free up memory). 
    ** Remove the remnants of that writers uncommitted transaction from 
    ** the hash-table before writing any new entries.
    */
    if( aPgno[idx] ){
      walCleanupHash(pWal);
      assert( !aPgno[idx] );
    }

    /* Write the aPgno[] array entry and the hash-table slot. */
    nCollide = idx;
    for(iKey=walHash(iPage); aHash[iKey]; iKey=walNextHash(iKey)){
      if( (nCollide--)==0 ) return SQLITE_CORRUPT_BKPT;
    }
    aPgno[idx] = iPage;
    aHash[iKey] = (ht_slot)idx;

#ifdef SQLITE_ENABLE_EXPENSIVE_ASSERT
    /* Verify that the number of entries in the hash table exactly equals
    ** the number of entries in the mapping region.
    */
    {
      int i;           /* Loop counter */
      int nEntry = 0;  /* Number of entries in the hash table */
      for(i=0; i<HASHTABLE_NSLOT; i++){ if( aHash[i] ) nEntry++; }
      assert( nEntry==idx );
    }

    /* Verify that the every entry in the mapping region is reachable
    ** via the hash table.  This turns out to be a really, really expensive
    ** thing to check, so only do this occasionally - not on every
    ** iteration.
    */
    if( (idx&0x3ff)==0 ){
      int i;           /* Loop counter */
      for(i=1; i<=idx; i++){
        for(iKey=walHash(aPgno[i]); aHash[iKey]; iKey=walNextHash(iKey)){
          if( aHash[iKey]==i ) break;
        }
        assert( aHash[iKey]==i );
      }
    }
#endif /* SQLITE_ENABLE_EXPENSIVE_ASSERT */
  }


  return rc;
}